

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void stbi__create_png_alpha_expand8(stbi_uc *dest,stbi_uc *src,stbi__uint32 x,int img_n)

{
  ulong uVar1;
  stbi_uc *psVar2;
  bool bVar3;
  
  if (img_n == 1) {
    if (-1 < (int)(x - 1)) {
      uVar1 = (ulong)(x - 1);
      do {
        dest[uVar1 * 2 + 1] = 0xff;
        dest[uVar1 * 2] = src[uVar1];
        bVar3 = uVar1 != 0;
        uVar1 = uVar1 - 1;
      } while (bVar3);
    }
  }
  else {
    if (img_n != 3) {
      __assert_fail("img_n == 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/mehedirm6244[P]sysfex/./lib/stb_image.h"
                    ,0x124c,
                    "void stbi__create_png_alpha_expand8(stbi_uc *, stbi_uc *, stbi__uint32, int)");
    }
    if (-1 < (int)(x - 1)) {
      uVar1 = (ulong)(x - 1);
      psVar2 = src + uVar1 * 3 + 2;
      do {
        dest[uVar1 * 4 + 3] = 0xff;
        dest[uVar1 * 4 + 2] = *psVar2;
        dest[uVar1 * 4 + 1] = psVar2[-1];
        dest[uVar1 * 4] = psVar2[-2];
        psVar2 = psVar2 + -3;
        bVar3 = uVar1 != 0;
        uVar1 = uVar1 - 1;
      } while (bVar3);
    }
  }
  return;
}

Assistant:

static void stbi__create_png_alpha_expand8(stbi_uc *dest, stbi_uc *src, stbi__uint32 x, int img_n)
{
   int i;
   // must process data backwards since we allow dest==src
   if (img_n == 1) {
      for (i=x-1; i >= 0; --i) {
         dest[i*2+1] = 255;
         dest[i*2+0] = src[i];
      }
   } else {
      STBI_ASSERT(img_n == 3);
      for (i=x-1; i >= 0; --i) {
         dest[i*4+3] = 255;
         dest[i*4+2] = src[i*3+2];
         dest[i*4+1] = src[i*3+1];
         dest[i*4+0] = src[i*3+0];
      }
   }
}